

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  long lVar1;
  int iVar2;
  Type TVar3;
  char *pcVar4;
  ostream *poVar5;
  long in_FS_OFFSET;
  char *local_40;
  TestPartResult *result_local;
  ostream *os_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = TestPartResult::file_name(result);
  poVar5 = std::operator<<(os,pcVar4);
  poVar5 = std::operator<<(poVar5,":");
  iVar2 = TestPartResult::line_number(result);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  poVar5 = std::operator<<(poVar5,": ");
  TVar3 = TestPartResult::type(result);
  if (TVar3 == kSuccess) {
    local_40 = "Success";
  }
  else {
    TVar3 = TestPartResult::type(result);
    local_40 = "Non-fatal failure";
    if (TVar3 == kFatalFailure) {
      local_40 = "Fatal failure";
    }
  }
  poVar5 = std::operator<<(poVar5,local_40);
  poVar5 = std::operator<<(poVar5,":\n");
  pcVar4 = TestPartResult::message(result);
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return poVar5;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}